

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O3

void I_ClosestResolution(int *width,int *height,int bits)

{
  bool bVar1;
  IVideo *pIVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int theight;
  int twidth;
  int local_48;
  int local_44;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  local_40 = 0;
  local_48 = 0;
  local_38 = bits;
  bVar1 = true;
  do {
    pIVar2 = Video;
    bVar3 = fullscreen.Value;
    if (screen != (DFrameBuffer *)0x0) {
      iVar4 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      bVar3 = (byte)iVar4;
    }
    (*pIVar2->_vptr_IVideo[5])(pIVar2,(ulong)local_38,(ulong)bVar3);
    iVar4 = (*Video->_vptr_IVideo[6])(Video,&local_34,&local_44,0);
    if ((char)iVar4 != '\0') {
      uVar7 = 0xffffffff;
      do {
        while( true ) {
          iVar4 = local_34 - *width;
          if ((iVar4 == 0) && (local_44 == *height)) {
            return;
          }
          if (bVar1) break;
          iVar5 = *height;
LAB_002c70e6:
          uVar6 = (local_44 - iVar5) * (local_44 - iVar5) + iVar4 * iVar4;
          bVar8 = uVar6 < uVar7;
          if (bVar8) {
            uVar7 = uVar6;
            local_48 = local_44;
          }
          local_40 = local_40 & 0xffffffff;
          if (bVar8) {
            local_40 = (ulong)local_34;
          }
          iVar4 = (*Video->_vptr_IVideo[6])(Video,&local_34,&local_44,0);
          if ((char)iVar4 == '\0') goto LAB_002c7145;
        }
        if ((*width <= (int)local_34) && (iVar5 = *height, iVar5 <= local_44)) goto LAB_002c70e6;
        iVar4 = (*Video->_vptr_IVideo[6])(Video,&local_34,&local_44,0);
      } while ((char)iVar4 != '\0');
      if (uVar7 != 0xffffffff) {
LAB_002c7145:
        *width = (int)local_40;
        *height = local_48;
        return;
      }
    }
    bVar8 = !bVar1;
    bVar1 = false;
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void I_ClosestResolution (int *width, int *height, int bits)
{
	int twidth, theight;
	int cwidth = 0, cheight = 0;
	int iteration;
	DWORD closest = 4294967295u;

	for (iteration = 0; iteration < 2; iteration++)
	{
		Video->StartModeIterator (bits, screen ? screen->IsFullscreen() : fullscreen);
		while (Video->NextMode (&twidth, &theight, NULL))
		{
			if (twidth == *width && theight == *height)
				return;

			if (iteration == 0 && (twidth < *width || theight < *height))
				continue;

			DWORD dist = (twidth - *width) * (twidth - *width)
				+ (theight - *height) * (theight - *height);

			if (dist < closest)
			{
				closest = dist;
				cwidth = twidth;
				cheight = theight;
			}
		}
		if (closest != 4294967295u)
		{
			*width = cwidth;
			*height = cheight;
			return;
		}
	}
}